

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O0

void __thiscall
qclab::qgates::QGate2<std::complex<double>_>::apply
          (QGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  long lVar1;
  int iVar2;
  value_type vVar3;
  int64_t iVar4;
  reference pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  complex<double> *pcVar9;
  byte bVar10;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  undefined8 uVar11;
  complex<double> local_518;
  complex<double> local_508;
  complex<double> local_4f8;
  complex<double> local_4e8;
  complex<double> local_4d8;
  complex<double> local_4c8;
  undefined8 local_4b8;
  undefined8 local_4b0;
  complex<double> local_4a8;
  complex<double> local_498;
  complex<double> local_488;
  complex<double> local_478;
  complex<double> local_468;
  complex<double> local_458;
  undefined8 local_448;
  undefined8 uStack_440;
  complex<double> local_438;
  complex<double> local_428;
  complex<double> local_418;
  complex<double> local_408;
  complex<double> local_3f8;
  complex<double> local_3e8;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  complex<double> local_3c8;
  complex<double> local_3b8;
  complex<double> local_3a8;
  complex<double> local_398;
  complex<double> local_388;
  complex<double> local_378;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined1 auStack_358 [8];
  complex<double> x4_1;
  complex<double> x3_1;
  complex<double> x2_1;
  complex<double> x1_1;
  int64_t i4;
  int64_t i3;
  int64_t i2;
  int64_t i1;
  int64_t i_1;
  int64_t k_1;
  int64_t j_1;
  int64_t nRight_1;
  int64_t nLeft_1;
  SquareMatrix<std::complex<double>_> local_2b8;
  complex<double> local_2a8;
  complex<double> local_298;
  complex<double> local_288;
  complex<double> local_278;
  complex<double> local_268;
  complex<double> local_258;
  undefined8 local_248;
  undefined8 local_240;
  complex<double> local_238;
  complex<double> local_228;
  complex<double> local_218;
  complex<double> local_208;
  complex<double> local_1f8;
  complex<double> local_1e8;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  complex<double> local_1c8;
  complex<double> local_1b8;
  complex<double> local_1a8;
  complex<double> local_198;
  complex<double> local_188;
  complex<double> local_178;
  undefined8 local_168;
  undefined8 uStack_160;
  complex<double> local_158;
  complex<double> local_148;
  complex<double> local_138;
  complex<double> local_128;
  complex<double> local_118;
  complex<double> local_108;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 auStack_e8 [8];
  complex<double> x4;
  complex<double> x3;
  complex<double> x2;
  complex<double> x1;
  int64_t j4;
  int64_t j3;
  int64_t j2;
  int64_t j1;
  int64_t j;
  int64_t k;
  int64_t i;
  int64_t nRight;
  int64_t nLeft;
  undefined1 local_50 [8];
  SquareMatrix<std::complex<double>_> mat2;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  SquareMatrix<std::complex<double>_> *matrix_local;
  int nbQubits_local;
  Op op_local;
  Side side_local;
  QGate2<std::complex<double>_> *this_local;
  
  if (nbQubits < 2) {
    __assert_fail("nbQubits >= 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x23,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  iVar4 = dense::SquareMatrix<std::complex<double>_>::size(matrix);
  bVar10 = (byte)nbQubits;
  if (iVar4 != 1 << (bVar10 & 0x1f)) {
    __assert_fail("matrix.size() == 1 << nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x24,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[5])(&mat2.data_);
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  *pvVar5 = offset + *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[0] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  if (nbQubits <= *pvVar5) {
    __assert_fail("qubits[1] < nbQubits",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x28,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
  iVar2 = *pvVar5;
  pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
  if (iVar2 + 1 != *pvVar5) {
    __assert_fail("qubits[0] + 1 == qubits[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/QGate2.cpp"
                  ,0x29,
                  "virtual void qclab::qgates::QGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
                 );
  }
  (*(this->super_QObject<std::complex<double>_>)._vptr_QObject[7])(local_50);
  dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>
            (op,(SquareMatrix<std::complex<double>_> *)local_50);
  if (side == Left) {
    if (nbQubits == 2) {
      dense::SquareMatrix<std::complex<double>_>::operator*=
                (matrix,(SquareMatrix<std::complex<double>_> *)local_50);
    }
    else {
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
      vVar3 = *pvVar5;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
      lVar6 = (long)(1 << ((bVar10 - (char)*pvVar5) - 1 & 0x1f));
      for (k = 0; iVar4 = dense::SquareMatrix<std::complex<double>_>::rows(matrix), k < iVar4;
          k = k + 1) {
        for (j = 0; j < 1 << ((byte)vVar3 & 0x1f); j = j + 1) {
          for (j1 = 0; j1 < lVar6; j1 = j1 + 1) {
            lVar1 = j1 + j * lVar6 * 4;
            lVar7 = lVar1 + lVar6;
            lVar8 = lVar7 + lVar6;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar1);
            x2._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar7);
            x3._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
            x2._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar8);
            x4._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
            x3._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar8 + lVar6);
            auStack_e8 = *(undefined1 (*) [8])pcVar9->_M_value;
            x4._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,0,0);
            std::operator*(pcVar9,(complex<double> *)(x2._M_value + 8));
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,1,0);
            std::operator*(pcVar9,(complex<double> *)(x3._M_value + 8));
            std::operator+(&local_128,&local_138);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,2,0);
            std::operator*(pcVar9,(complex<double> *)(x4._M_value + 8));
            std::operator+(&local_118,&local_148);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,3,0);
            std::operator*(pcVar9,(complex<double> *)auStack_e8);
            uVar11 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
            std::operator+(&local_108,&local_158);
            local_f8 = CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
            uStack_f0 = uVar11;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar1);
            *(undefined8 *)pcVar9->_M_value = local_f8;
            *(undefined8 *)(pcVar9->_M_value + 8) = uStack_f0;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,0,1);
            std::operator*(pcVar9,(complex<double> *)(x2._M_value + 8));
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,1,1);
            std::operator*(pcVar9,(complex<double> *)(x3._M_value + 8));
            std::operator+(&local_198,&local_1a8);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,2,1);
            std::operator*(pcVar9,(complex<double> *)(x4._M_value + 8));
            std::operator+(&local_188,&local_1b8);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,3,1);
            std::operator*(pcVar9,(complex<double> *)auStack_e8);
            uVar11 = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
            std::operator+(&local_178,&local_1c8);
            local_168 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
            uStack_160 = uVar11;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar7);
            *(undefined8 *)pcVar9->_M_value = local_168;
            *(undefined8 *)(pcVar9->_M_value + 8) = uStack_160;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,0,2);
            std::operator*(pcVar9,(complex<double> *)(x2._M_value + 8));
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,1,2);
            std::operator*(pcVar9,(complex<double> *)(x3._M_value + 8));
            std::operator+(&local_208,&local_218);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,2,2);
            std::operator*(pcVar9,(complex<double> *)(x4._M_value + 8));
            std::operator+(&local_1f8,&local_228);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,3,2);
            std::operator*(pcVar9,(complex<double> *)auStack_e8);
            uVar11 = CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
            std::operator+(&local_1e8,&local_238);
            local_1d8 = CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04);
            uStack_1d0 = uVar11;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar8);
            *(undefined8 *)pcVar9->_M_value = local_1d8;
            *(undefined8 *)(pcVar9->_M_value + 8) = uStack_1d0;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,0,3);
            std::operator*(pcVar9,(complex<double> *)(x2._M_value + 8));
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,1,3);
            std::operator*(pcVar9,(complex<double> *)(x3._M_value + 8));
            std::operator+(&local_278,&local_288);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,2,3);
            std::operator*(pcVar9,(complex<double> *)(x4._M_value + 8));
            std::operator+(&local_268,&local_298);
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                               ((SquareMatrix<std::complex<double>_> *)local_50,3,3);
            std::operator*(pcVar9,(complex<double> *)auStack_e8);
            uVar11 = CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
            std::operator+(&local_258,&local_2a8);
            local_248 = CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06);
            local_240 = uVar11;
            pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,k,lVar8 + lVar6);
            *(undefined8 *)pcVar9->_M_value = local_248;
            *(undefined8 *)(pcVar9->_M_value + 8) = local_240;
          }
        }
      }
    }
  }
  else if (nbQubits == 2) {
    dense::SquareMatrix<std::complex<double>_>::SquareMatrix
              ((SquareMatrix<std::complex<double>_> *)&nLeft_1,
               (SquareMatrix<std::complex<double>_> *)local_50);
    dense::operator*((dense *)&local_2b8,(SquareMatrix<std::complex<double>_> *)&nLeft_1,matrix);
    dense::SquareMatrix<std::complex<double>_>::operator=(matrix,&local_2b8);
    dense::SquareMatrix<std::complex<double>_>::~SquareMatrix(&local_2b8);
    dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
              ((SquareMatrix<std::complex<double>_> *)&nLeft_1);
  }
  else {
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&mat2.data_,0);
    vVar3 = *pvVar5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&mat2.data_,1);
    lVar6 = (long)(1 << ((bVar10 - (char)*pvVar5) - 1 & 0x1f));
    for (k_1 = 0; iVar4 = dense::SquareMatrix<std::complex<double>_>::cols(matrix), k_1 < iVar4;
        k_1 = k_1 + 1) {
      for (i_1 = 0; i_1 < 1 << ((byte)vVar3 & 0x1f); i_1 = i_1 + 1) {
        for (i1 = 0; i1 < lVar6; i1 = i1 + 1) {
          lVar1 = i1 + i_1 * lVar6 * 4;
          lVar7 = lVar1 + lVar6;
          lVar8 = lVar7 + lVar6;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar1,k_1);
          x2_1._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar7,k_1);
          x3_1._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
          x2_1._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar8,k_1);
          x4_1._M_value._8_8_ = *(undefined8 *)pcVar9->_M_value;
          x3_1._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar8 + lVar6,k_1);
          auStack_358 = *(undefined1 (*) [8])pcVar9->_M_value;
          x4_1._M_value._0_8_ = *(undefined8 *)(pcVar9->_M_value + 8);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,0,0);
          std::operator*(pcVar9,(complex<double> *)(x2_1._M_value + 8));
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,0,1);
          std::operator*(pcVar9,(complex<double> *)(x3_1._M_value + 8));
          std::operator+(&local_398,&local_3a8);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,0,2);
          std::operator*(pcVar9,(complex<double> *)(x4_1._M_value + 8));
          std::operator+(&local_388,&local_3b8);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,0,3);
          std::operator*(pcVar9,(complex<double> *)auStack_358);
          uVar11 = CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
          std::operator+(&local_378,&local_3c8);
          local_368 = CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08);
          uStack_360 = uVar11;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar1,k_1);
          *(undefined8 *)pcVar9->_M_value = local_368;
          *(undefined8 *)(pcVar9->_M_value + 8) = uStack_360;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,1,0);
          std::operator*(pcVar9,(complex<double> *)(x2_1._M_value + 8));
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,1,1);
          std::operator*(pcVar9,(complex<double> *)(x3_1._M_value + 8));
          std::operator+(&local_408,&local_418);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,1,2);
          std::operator*(pcVar9,(complex<double> *)(x4_1._M_value + 8));
          std::operator+(&local_3f8,&local_428);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,1,3);
          std::operator*(pcVar9,(complex<double> *)auStack_358);
          uVar11 = CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
          std::operator+(&local_3e8,&local_438);
          local_3d8 = CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10);
          uStack_3d0 = uVar11;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar7,k_1);
          *(undefined8 *)pcVar9->_M_value = local_3d8;
          *(undefined8 *)(pcVar9->_M_value + 8) = uStack_3d0;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,2,0);
          std::operator*(pcVar9,(complex<double> *)(x2_1._M_value + 8));
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,2,1);
          std::operator*(pcVar9,(complex<double> *)(x3_1._M_value + 8));
          std::operator+(&local_478,&local_488);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,2,2);
          std::operator*(pcVar9,(complex<double> *)(x4_1._M_value + 8));
          std::operator+(&local_468,&local_498);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,2,3);
          std::operator*(pcVar9,(complex<double> *)auStack_358);
          uVar11 = CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
          std::operator+(&local_458,&local_4a8);
          local_448 = CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12);
          uStack_440 = uVar11;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar8,k_1);
          *(undefined8 *)pcVar9->_M_value = local_448;
          *(undefined8 *)(pcVar9->_M_value + 8) = uStack_440;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,3,0);
          std::operator*(pcVar9,(complex<double> *)(x2_1._M_value + 8));
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,3,1);
          std::operator*(pcVar9,(complex<double> *)(x3_1._M_value + 8));
          std::operator+(&local_4e8,&local_4f8);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,3,2);
          std::operator*(pcVar9,(complex<double> *)(x4_1._M_value + 8));
          std::operator+(&local_4d8,&local_508);
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()
                             ((SquareMatrix<std::complex<double>_> *)local_50,3,3);
          std::operator*(pcVar9,(complex<double> *)auStack_358);
          uVar11 = CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13);
          std::operator+(&local_4c8,&local_518);
          local_4b8 = CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14);
          local_4b0 = uVar11;
          pcVar9 = dense::SquareMatrix<std::complex<double>_>::operator()(matrix,lVar8 + lVar6,k_1);
          *(undefined8 *)pcVar9->_M_value = local_4b8;
          *(undefined8 *)(pcVar9->_M_value + 8) = local_4b0;
        }
      }
    }
  }
  dense::SquareMatrix<std::complex<double>_>::~SquareMatrix
            ((SquareMatrix<std::complex<double>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&mat2.data_);
  return;
}

Assistant:

void QGate2< T >::apply( Side side , Op op , const int nbQubits ,
                           qclab::dense::SquareMatrix< T >& matrix ,
                           const int offset ) const {
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    assert( qubits[0] + 1 == qubits[1] ) ;  // nearest neighbor qubtis
    // operation
    qclab::dense::SquareMatrix< T >  mat2 = this->matrix() ;
    qclab::dense::operateInPlace( op , mat2 ) ;
    // side
    if ( side == Side::Left ) {
      if ( nbQubits == 2 ) {
        matrix *= mat2 ;
      } else {
        // matrix *= kron( Ileft , mat2 , Iright )
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 4 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const int64_t j3 = j2 + nRight ;
              const int64_t j4 = j3 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              const T x3 = matrix(i,j3) ;
              const T x4 = matrix(i,j4) ;
              matrix(i,j1) = mat2(0,0) * x1 + mat2(1,0) * x2 +
                             mat2(2,0) * x3 + mat2(3,0) * x4 ;
              matrix(i,j2) = mat2(0,1) * x1 + mat2(1,1) * x2 +
                             mat2(2,1) * x3 + mat2(3,1) * x4 ;
              matrix(i,j3) = mat2(0,2) * x1 + mat2(1,2) * x2 +
                             mat2(2,2) * x3 + mat2(3,2) * x4 ;
              matrix(i,j4) = mat2(0,3) * x1 + mat2(1,3) * x2 +
                             mat2(2,3) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    } else {
      if ( nbQubits == 2 ) {
        matrix = mat2 * matrix ;
      } else {
        // matrix = kron( Ileft , mat2 , Iright ) * matrix
        const int64_t nLeft  = 1 << qubits[0] ;
        const int64_t nRight = 1 << ( nbQubits - qubits[1] - 1 ) ;
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 4 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const int64_t i3 = i2 + nRight ;
              const int64_t i4 = i3 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              const T x3 = matrix(i3,j) ;
              const T x4 = matrix(i4,j) ;
              matrix(i1,j) = mat2(0,0) * x1 + mat2(0,1) * x2 +
                             mat2(0,2) * x3 + mat2(0,3) * x4 ;
              matrix(i2,j) = mat2(1,0) * x1 + mat2(1,1) * x2 +
                             mat2(1,2) * x3 + mat2(1,3) * x4 ;
              matrix(i3,j) = mat2(2,0) * x1 + mat2(2,1) * x2 +
                             mat2(2,2) * x3 + mat2(2,3) * x4 ;
              matrix(i4,j) = mat2(3,0) * x1 + mat2(3,1) * x2 +
                             mat2(3,2) * x3 + mat2(3,3) * x4 ;
            }
          }
        }
      }
    }
  }